

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

uint SOIL_load_OGL_single_cubemap_from_memory
               (uchar *buffer,int buffer_length,char *face_order,int force_channels,
               uint reuse_texture_ID,uint flags)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uchar *data;
  int channels;
  int local_3c;
  int height;
  int width;
  
  if (buffer == (uchar *)0x0) {
    result_string_pointer = "Invalid single cube map buffer";
  }
  else {
    if (((flags & 0x40) != 0) &&
       (local_3c = buffer_length,
       uVar1 = SOIL_direct_load_DDS_from_memory(buffer,buffer_length,reuse_texture_ID,flags,1),
       buffer_length = local_3c, uVar1 != 0)) {
      return uVar1;
    }
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      if ((0x13 < (byte)face_order[lVar3] - 0x44) ||
         ((0xa8403U >> ((byte)face_order[lVar3] - 0x44 & 0x1f) & 1) == 0)) {
        result_string_pointer = "Invalid single cube map face order";
        return 0;
      }
    }
    iVar2 = query_cubemap_capability();
    if (iVar2 == 1) {
      data = SOIL_load_image_from_memory
                       (buffer,buffer_length,&width,&height,&channels,force_channels);
      if (force_channels - 1U < 4) {
        channels = force_channels;
      }
      if (data == (uchar *)0x0) {
        result_string_pointer = stbi_failure_reason();
      }
      else {
        if ((width == height * 6) || (width * 6 == height)) {
          uVar1 = SOIL_create_OGL_single_cubemap
                            (data,width,height,channels,face_order,reuse_texture_ID,flags);
          free(data);
          return uVar1;
        }
        free(data);
        result_string_pointer = "Single cubemap image must have a 6:1 ratio";
      }
    }
    else {
      result_string_pointer = "No cube map capability present";
    }
  }
  return 0;
}

Assistant:

unsigned int
	SOIL_load_OGL_single_cubemap_from_memory
	(
		const unsigned char *const buffer,
		int buffer_length,
		const char face_order[6],
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels, i;
	unsigned int tex_id = 0;
	/*	error checking	*/
	if( buffer == NULL )
	{
		result_string_pointer = "Invalid single cube map buffer";
		return 0;
	}
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS_from_memory(
				buffer, buffer_length,
				reuse_texture_ID, flags, 1 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	face order checking	*/
	for( i = 0; i < 6; ++i )
	{
		if( (face_order[i] != 'N') &&
			(face_order[i] != 'S') &&
			(face_order[i] != 'W') &&
			(face_order[i] != 'E') &&
			(face_order[i] != 'U') &&
			(face_order[i] != 'D') )
		{
			result_string_pointer = "Invalid single cube map face order";
			return 0;
		};
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st off, try to load the full image	*/
	img = SOIL_load_image_from_memory(
			buffer, buffer_length,
			&width, &height, &channels,
			force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	now, does this image have the right dimensions?	*/
	if( (width != 6*height) &&
		(6*width != height) )
	{
		SOIL_free_image_data( img );
		result_string_pointer = "Single cubemap image must have a 6:1 ratio";
		return 0;
	}
	/*	try the image split and create	*/
	tex_id = SOIL_create_OGL_single_cubemap(
			img, width, height, channels,
			face_order, reuse_texture_ID, flags
			);
	/*	nuke the temporary image data and return the texture handle	*/
	SOIL_free_image_data( img );
	return tex_id;
}